

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O1

void __thiscall soul::IdentifierPath::~IdentifierPath(IdentifierPath *this)

{
  Identifier *pIVar1;
  
  (this->pathSections).numActive = 0;
  if (8 < (this->pathSections).numAllocated) {
    pIVar1 = (this->pathSections).items;
    if (pIVar1 != (Identifier *)0x0) {
      operator_delete__(pIVar1);
    }
    (this->pathSections).items = (Identifier *)(this->pathSections).space;
    (this->pathSections).numAllocated = 8;
  }
  return;
}

Assistant:

void clear() noexcept
    {
        for (size_t i = 0; i < numActive; ++i)
            items[i].~Item();

        numActive = 0;
        freeIfHeapAllocated();
    }